

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

Result __thiscall
tonk::Connection::completeIncomingConnection(Connection *this,UDPAddress *peerUDPAddress)

{
  Channel *this_00;
  in6_addr *config;
  ErrorResult *pEVar1;
  ostringstream *poVar2;
  long lVar3;
  bool bVar4;
  uint16_t port;
  int iVar5;
  OutputWorker *pOVar6;
  _func_int **pp_Var7;
  UDPAddress *in_RDX;
  Result flushResult;
  TonkAddress appAddress;
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_350;
  undefined1 local_340 [16];
  ErrorResult local_330 [2];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [16];
  ErrorResult local_1a8 [2];
  ios_base local_138 [264];
  
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  if ((in_RDX->impl_).data_.base.sa_family == 2) {
    local_360._0_8_ = (ulong)(in_RDX->impl_).data_.v6.sin6_flowinfo << 0x20;
    local_360._8_8_ = 0;
    aStack_350._M_allocated_capacity = 0;
    aStack_350._8_8_ = 0;
  }
  else {
    local_360._8_8_ = *(long *)((long)&(in_RDX->impl_).data_ + 8);
    aStack_350._M_allocated_capacity = *(size_type *)((long)&(in_RDX->impl_).data_ + 0x10);
    aStack_350._8_8_ = ZEXT48((in_RDX->impl_).data_.v6.sin6_scope_id);
    local_360._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
  }
  this_00 = (Channel *)((long)&peerUDPAddress[9].impl_.data_.v6.sin6_addr.__in6_u + 0xc);
  asio::ip::address::to_string_abi_cxx11_((string *)local_340,(address *)local_360);
  port = swap_bytes((in_RDX->impl_).data_.v4.sin_port);
  GetConnectionLogPrefix((string *)local_1b8,(string *)local_340,port);
  logger::Channel::SetPrefix(this_00,(string *)local_1b8);
  if ((ErrorResult *)local_1b8._0_8_ != (ErrorResult *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_);
  }
  pEVar1 = (ErrorResult *)(local_340 + 0x10);
  if ((ErrorResult *)local_340._0_8_ != pEVar1) {
    operator_delete((void *)local_340._0_8_);
  }
  initSubsystems((Connection *)local_1b8);
  (this->super_IConnection)._vptr_IConnection = (_func_int **)local_1b8._0_8_;
  local_1b8._0_8_ = (ErrorResult *)0x0;
  Result::~Result((Result *)local_1b8);
  if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
    SessionOutgoing::SetPeerUDPAddress
              ((SessionOutgoing *)((long)&peerUDPAddress[0xc].impl_.data_ + 0x18),in_RDX);
    resetTimers((Connection *)peerUDPAddress,
                *(uint32_t *)(*(long *)&peerUDPAddress[8].impl_.data_ + 0x38),true);
    bVar4 = ConnectionIdMap::InsertAndAssignId
                      (*(ConnectionIdMap **)((long)&peerUDPAddress[4].impl_.data_ + 0x18),
                       (id_t *)((long)&peerUDPAddress[0x72d].impl_.data_ + 0x14),
                       (IConnection *)peerUDPAddress);
    if (!bVar4 && *(int *)&peerUDPAddress[10].impl_.data_ < 4) {
      local_340._0_8_ = this_00->ChannelName;
      poVar2 = (ostringstream *)(local_340 + 0x10);
      local_340._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,*(char **)((long)&peerUDPAddress[0xb].impl_.data_ + 0x14),
                 *(long *)&peerUDPAddress[0xc].impl_.data_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "completeConnectionInitialization: Failed to insert new connection into id map",
                 0x4d);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_340);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_2c0);
    }
    queueAddressAndIdChangeMessage((Connection *)peerUDPAddress,in_RDX);
    SetTonkAddressStr((TonkAddress *)local_1b8,in_RDX);
    lVar3 = *(long *)&peerUDPAddress[8].impl_.data_;
    config = &peerUDPAddress[8].impl_.data_.v6.sin6_addr;
    iVar5 = (**(code **)(lVar3 + 0x50))(*(undefined8 *)(lVar3 + 8),peerUDPAddress,local_1b8,config);
    if (iVar5 == 0) {
      local_340._0_8_ = pEVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_340,"Application OnIncomingConnection() callback denied connection"
                 ,"");
      pp_Var7 = (_func_int **)operator_new(0x38);
      *pp_Var7 = (_func_int *)"Connection::completeConnectionInitialization";
      pp_Var7[1] = (_func_int *)(pp_Var7 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var7 + 1),local_340._0_8_,
                 (char *)((long)(char **)local_340._0_8_ +
                         CONCAT44(local_340._12_4_,local_340._8_4_)));
      *(undefined4 *)(pp_Var7 + 5) = 0;
      pp_Var7[6] = (_func_int *)0x2;
      (this->super_IConnection)._vptr_IConnection = pp_Var7;
      local_360._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      Result::~Result((Result *)local_360);
      if ((ErrorResult *)local_340._0_8_ != pEVar1) {
        operator_delete((void *)local_340._0_8_);
      }
    }
    else {
      MakeCallbacksOptional((TonkConnectionConfig *)config);
      SessionOutgoing::Flush((SessionOutgoing *)local_340);
      if ((ErrorResult *)local_340._0_8_ != (ErrorResult *)0x0) {
        RefCounter::StartShutdown
                  ((RefCounter *)&(peerUDPAddress->impl_).data_.v6.sin6_addr,2,(Result *)local_340);
      }
      postNextTimer((Connection *)peerUDPAddress);
      Result::~Result((Result *)local_340);
    }
  }
  if ((this->super_IConnection)._vptr_IConnection != (_func_int **)0x0) {
    Result::ToJson_abi_cxx11_((string *)local_360,(Result *)this);
    if (*(int *)&peerUDPAddress[10].impl_.data_ < 4) {
      local_1b8._0_8_ = this_00->ChannelName;
      poVar2 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,*(char **)((long)&peerUDPAddress[0xb].impl_.data_ + 0x14),
                 *(long *)&peerUDPAddress[0xc].impl_.data_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Connection::completeIncomingConnection failed: ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(char *)local_360._0_8_,local_360._8_8_);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != &aStack_350) {
      operator_delete((void *)local_360._0_8_);
    }
    Shutdown((Connection *)peerUDPAddress);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::completeIncomingConnection(const UDPAddress& peerUDPAddress)
{
    Result result;

    try
    {
        Logger.SetPrefix(GetConnectionLogPrefix(
            peerUDPAddress.address().to_string(),
            peerUDPAddress.port()));

        result = initSubsystems();
        if (result.IsFail()) {
            goto OnError;
        }

        // Update the peer address for outgoing data
        Outgoing.SetPeerUDPAddress(peerUDPAddress);

        // Initialize timers for incoming connection
        resetTimers(SocketConfig->ConnectionTimeoutUsec, true);

        /*
            This is the right time to assign a Connection Id, before any
            messages are queued for delivery to the peer.

            The Connection Id is used to reconnect if the source IP address or
            port changes during a connection.  Both client and server in a
            connection are assigned a Connection Id by the other side.
            And both peers are able to change their source address by sending
            a valid datagram with the ID flag set.
        */
        if (!Deps.IdMap->InsertAndAssignId(LocallyAssignedIdForRemoteHost, this))
        {
            // Id assignment can only fail if too many clients were allowed to
            // connect, which should not be possible.
            TONK_DEBUG_BREAK();
            Logger.Warning("completeConnectionInitialization: Failed to insert new connection into id map");
        }

        // Write control channel data before the OnConnect() callback so that
        // any tonk_flush() will include the control channel data in the first
        // UDP response datagram
        queueAddressAndIdChangeMessage(peerUDPAddress);

        TonkAddress appAddress;
        SetTonkAddressStr(appAddress, peerUDPAddress);

        // FIXME: If this asserts we currently seem to shut down uncleanly
        const uint32_t appDecision = SocketConfig->OnIncomingConnection(
            SocketConfig->AppContextPtr,
            GetTonkConnection(),
            &appAddress,
            &ConnectionConfig);
        if (TONK_DENY_CONNECTION == appDecision)
        {
            result = Result("Connection::completeConnectionInitialization", "Application OnIncomingConnection() callback denied connection", ErrorType::Tonk);
            goto OnError;
        }

        MakeCallbacksOptional(ConnectionConfig);

        // TBD: We could call OnConnect() here and some apps may have lower
        // latency to establish connections.  It is already possible to react
        // with the same speed to the OnIncomingConnection() callback though.
        // Right now OnConnect() is called when the first ID update control
        // message is received from the client.
        //ConnectionConfig.OnConnect(ConnectionConfig.AppContextPtr, GetTonkConnection());

        /*
            For the server, we do not want to delay delivery of the client's ID
            until the next timed or application flush, so perform a flush here.
            This still allows the application to submit data in the first round.
        */
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());

        // Buffer enough flush space for the first connection request message
        Result flushResult = Outgoing.Flush();
        if (flushResult.IsFail()) {
            SelfRefCount.StartShutdown(Tonk_Error, flushResult);
        }

        postNextTimer();
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("Connection::completeConnectionInitialization", "Exception!", ErrorType::Tonk);
        goto OnError;
    }

OnError:
    if (result.IsFail())
    {
        Logger.Warning("Connection::completeIncomingConnection failed: ", result.ToJson());
        Shutdown();
    }

    return result;
}